

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc-type-utils.h
# Opt level: O2

EvaluationResult wasm::GCTypeUtils::evaluateCastCheck(Type refType,Type castType)

{
  bool bVar1;
  EvaluationResult EVar2;
  HeapType local_38;
  HeapType refHeapType;
  HeapType castHeapType;
  Type castType_local;
  Type refType_local;
  anon_class_1_0_00000001 isHeapSubtype;
  
  if (((refType.id & 1) == 0 && 6 < refType.id) && (6 < castType.id && (castType.id & 1) == 0)) {
    castHeapType.id = castType.id;
    castType_local = refType;
    bVar1 = isUninhabitable(refType);
    if (bVar1) {
      EVar2 = Unreachable;
    }
    else {
      local_38 = Type::getHeapType(&castType_local);
      if (((castType.id & 2) != 0) || (bVar1 = HeapType::isBottom(&local_38), !bVar1)) {
        refHeapType = Type::getHeapType((Type *)&castHeapType);
        bVar1 = evaluateCastCheck::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&refType_local.id + 7),castType_local,
                           (Type)castHeapType.id);
        if (bVar1) {
          if (6 < castHeapType.id && ((uint)castHeapType.id & 3) == 2) {
            return Success;
          }
          if (6 < castType_local.id && (castType_local.id & 3) == 0) {
            return Success;
          }
          if ((castType_local.id < 7) || ((int)(castType_local.id & 3) != 2)) {
            __assert_fail("refType.isNullable()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/gc-type-utils.h"
                          ,0x85,"EvaluationResult wasm::GCTypeUtils::evaluateCastCheck(Type, Type)")
            ;
          }
          if ((6 < castHeapType.id) && ((castHeapType.id & 3) == 0)) {
            return SuccessOnlyIfNonNull;
          }
          __assert_fail("castType.isNonNullable()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/gc-type-utils.h"
                        ,0x86,"EvaluationResult wasm::GCTypeUtils::evaluateCastCheck(Type, Type)");
        }
        bVar1 = evaluateCastCheck::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&refType_local.id + 7),
                           (Type)castHeapType.id,castType_local);
        if ((bVar1) && (bVar1 = HeapType::isBottom(&refHeapType), !bVar1)) {
          return Unknown;
        }
        if (castType_local.id < 7 || (castType_local.id & 3) != 0) {
          return ((castHeapType.id & 3) == 0 && 6 < castHeapType.id) ^ SuccessOnlyIfNull;
        }
      }
      EVar2 = Failure;
    }
  }
  else {
    EVar2 = (uint)(refType.id == 1) * 5;
  }
  return EVar2;
}

Assistant:

inline EvaluationResult evaluateCastCheck(Type refType, Type castType) {
  if (!refType.isRef() || !castType.isRef()) {
    if (refType == Type::unreachable) {
      return Unreachable;
    }
    // If the cast type is unreachable, we can't tell - perhaps this is a br
    // instruction of some kind, that has unreachable type normally.
    return Unknown;
  }

  if (isUninhabitable(refType)) {
    // No value can appear in the ref, so the cast cannot be reached.
    return Unreachable;
  }

  auto refHeapType = refType.getHeapType();

  if (castType.isNonNullable() && refHeapType.isBottom()) {
    // Non-null references to bottom types do not exist, so there's no value
    // that could make the cast succeed.
    //
    // Note that there is an interesting corner case that is relevant here: if
    // the ref type is uninhabitable, say (ref nofunc), and the cast type is
    // non-nullable, say (ref func), then we have two contradictory rules that
    // seem to apply:
    //
    //  * A non-nullable cast of a bottom type must fail.
    //  * A cast of a subtype must succeed.
    //
    // In practice the uninhabitable type means that the cast is not even
    // reached, which is why there is no contradiction here. To avoid ambiguity,
    // we already checked for uninhabitability earlier, and returned
    // Unreachable.
    return Failure;
  }

  auto castHeapType = castType.getHeapType();

  // Check whether a value of type `a` is known to also have type `b`, assuming
  // it is non-null.
  auto isHeapSubtype = [](Type a, Type b) {
    // If the heap type of `a` has no subtypes, then we know its value must be
    // exactly `a`.
    // TODO: Use information from a subtypes analysis, if available.
    if (!a.getHeapType().isBasic() && !a.getHeapType().isOpen()) {
      a = a.with(Exact);
    }
    // Ignore nullability.
    return Type::isSubType(a.with(NonNullable), b.with(NonNullable));
  };

  auto refIsHeapSubType = isHeapSubtype(refType, castType);

  if (refIsHeapSubType) {
    // The heap type is a subtype. All we need is for nullability to work out as
    // well, and then the cast must succeed.
    if (castType.isNullable() || refType.isNonNullable()) {
      return Success;
    }

    // If the heap type part of the cast is compatible but the cast as a whole
    // is not, we must have a nullable input ref that we are casting to a
    // non-nullable type.
    assert(refType.isNullable());
    assert(castType.isNonNullable());
    return SuccessOnlyIfNonNull;
  }

  auto castIsHeapSubType = isHeapSubtype(castType, refType);
  bool heapTypesCompatible = refIsHeapSubType || castIsHeapSubType;

  if (!heapTypesCompatible || castHeapType.isBottom()) {
    // If the heap types are incompatible or if it is impossible to have a
    // non-null reference to the target heap type, then the only way the cast
    // can succeed is if it allows nulls and the input is null.
    //
    // Note that this handles uninhabitability of the cast type.
    if (refType.isNonNullable() || castType.isNonNullable()) {
      return Failure;
    }

    // Both are nullable. A null is the only hope of success in either
    // situation.
    return SuccessOnlyIfNull;
  }

  return Unknown;
}